

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-detection.c
# Opt level: O0

void coda_detection_rule_delete(coda_detection_rule *detection_rule)

{
  int local_14;
  int i;
  coda_detection_rule *detection_rule_local;
  
  if (detection_rule->entry != (coda_detection_rule_entry **)0x0) {
    for (local_14 = 0; local_14 < detection_rule->num_entries; local_14 = local_14 + 1) {
      if (detection_rule->entry[local_14] != (coda_detection_rule_entry *)0x0) {
        coda_detection_rule_entry_delete(detection_rule->entry[local_14]);
      }
    }
    free(detection_rule->entry);
  }
  free(detection_rule);
  return;
}

Assistant:

void coda_detection_rule_delete(coda_detection_rule *detection_rule)
{
    if (detection_rule->entry != NULL)
    {
        int i;

        for (i = 0; i < detection_rule->num_entries; i++)
        {
            if (detection_rule->entry[i] != NULL)
            {
                coda_detection_rule_entry_delete(detection_rule->entry[i]);
            }
        }
        free(detection_rule->entry);
    }
    free(detection_rule);
}